

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::convert_buffer_latin1
               (char_t **out_buffer,size_t *out_length,void *contents,size_t size,bool is_mutable)

{
  size_t __n;
  long lVar1;
  value_type vVar2;
  long lVar3;
  char_t *__dest;
  value_type puVar4;
  uint8_t *oend;
  uint8_t *obegin;
  char_t *buffer;
  size_t length;
  size_t postfix_length;
  uint8_t *postfix;
  size_t prefix_length;
  size_t data_length;
  uint8_t *data;
  bool is_mutable_local;
  size_t size_local;
  void *contents_local;
  size_t *out_length_local;
  char_t **out_buffer_local;
  
  __n = get_latin1_7bit_prefix_length((uint8_t *)contents,size);
  if (size < __n) {
    __assert_fail("prefix_length <= data_length",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                  ,0x8b8,
                  "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                 );
  }
  lVar1 = size - __n;
  if (lVar1 == 0) {
    out_buffer_local._7_1_ = get_mutable_buffer(out_buffer,out_length,contents,size,is_mutable);
  }
  else {
    vVar2 = latin1_decoder::process<pugi::impl::(anonymous_namespace)::utf8_counter>
                      ((long)contents + __n,lVar1,0);
    lVar3 = __n + vVar2;
    __dest = (char_t *)
             (*(code *)(anonymous_namespace)::xml_memory_management_function_storage<int>::allocate)
                       (lVar3 + 1);
    if (__dest == (char_t *)0x0) {
      out_buffer_local._7_1_ = false;
    }
    else {
      memcpy(__dest,contents,__n);
      puVar4 = latin1_decoder::process<pugi::impl::(anonymous_namespace)::utf8_writer>
                         ((long)contents + __n,lVar1,__dest + __n);
      if (puVar4 != (value_type)(__dest + lVar3)) {
        __assert_fail("oend == obegin + length",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/external/pugixml/pugixml.cpp"
                      ,0x8cd,
                      "bool pugi::impl::(anonymous namespace)::convert_buffer_latin1(char_t *&, size_t &, const void *, size_t, bool)"
                     );
      }
      *puVar4 = '\0';
      *out_buffer = __dest;
      *out_length = lVar3 + 1;
      out_buffer_local._7_1_ = true;
    }
  }
  return out_buffer_local._7_1_;
}

Assistant:

PUGI__FN bool convert_buffer_latin1(char_t*& out_buffer, size_t& out_length, const void* contents, size_t size, bool is_mutable)
	{
		const uint8_t* data = static_cast<const uint8_t*>(contents);
		size_t data_length = size;

		// get size of prefix that does not need utf8 conversion
		size_t prefix_length = get_latin1_7bit_prefix_length(data, data_length);
		assert(prefix_length <= data_length);

		const uint8_t* postfix = data + prefix_length;
		size_t postfix_length = data_length - prefix_length;

		// if no conversion is needed, just return the original buffer
		if (postfix_length == 0) return get_mutable_buffer(out_buffer, out_length, contents, size, is_mutable);

		// first pass: get length in utf8 units
		size_t length = prefix_length + latin1_decoder::process(postfix, postfix_length, 0, utf8_counter());

		// allocate buffer of suitable length
		char_t* buffer = static_cast<char_t*>(xml_memory::allocate((length + 1) * sizeof(char_t)));
		if (!buffer) return false;

		// second pass: convert latin1 input to utf8
		memcpy(buffer, data, prefix_length);

		uint8_t* obegin = reinterpret_cast<uint8_t*>(buffer);
		uint8_t* oend = latin1_decoder::process(postfix, postfix_length, obegin + prefix_length, utf8_writer());

		assert(oend == obegin + length);
		*oend = 0;

		out_buffer = buffer;
		out_length = length + 1;

		return true;
	}